

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>::
emplaceRealloc<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
           *this,pointer pos,
          variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *args)

{
  ulong uVar1;
  SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>> *p;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>> *pSVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar8 = 0x7ffffffffffffff;
  }
  lVar6 = (long)pos - *(long *)this;
  puVar3 = (undefined8 *)operator_new(uVar8 << 4);
  uVar2 = *(undefined8 *)
           &(args->
            super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
            super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
            ._M_index;
  *(undefined8 *)((long)puVar3 + lVar6) =
       (args->super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
       super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       _M_u;
  ((undefined8 *)((long)puVar3 + lVar6))[1] = uVar2;
  p = *(SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>> **
       )this;
  lVar7 = *(long *)(this + 8);
  pSVar5 = p;
  puVar4 = puVar3;
  if (p + (lVar7 * 0x10 - (long)pos) ==
      (SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>> *)
      0x0) {
    if (lVar7 != 0) {
      do {
        uVar2 = *(undefined8 *)(pSVar5 + 8);
        *puVar4 = *(undefined8 *)pSVar5;
        puVar4[1] = uVar2;
        pSVar5 = pSVar5 + 0x10;
        puVar4 = puVar4 + 2;
      } while (pSVar5 != (SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
                          *)pos);
    }
  }
  else {
    for (; pSVar5 != (SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
                      *)pos; pSVar5 = pSVar5 + 0x10) {
      uVar2 = *(undefined8 *)(pSVar5 + 8);
      *puVar4 = *(undefined8 *)pSVar5;
      puVar4[1] = uVar2;
      puVar4 = puVar4 + 2;
    }
    memcpy((void *)((long)puVar3 + lVar6 + 0x10),pos,
           ((ulong)(p + (lVar7 * 0x10 - (long)pos) + -0x10) & 0xfffffffffffffff0) + 0x10);
  }
  if (p != this + 0x18) {
    operator_delete(p);
    lVar7 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar7 + 1;
  *(ulong *)(this + 0x10) = uVar8;
  *(undefined8 **)this = puVar3;
  return (pointer)((long)puVar3 + lVar6);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}